

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O3

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseBase62Number
          (RustSymbolParser *this,int *value)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  
  *value = -1;
  iVar2 = this->pos_;
  bVar1 = this->encoding_[iVar2];
  if (bVar1 == 0x5f) {
    this->pos_ = iVar2 + 1;
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) {
      return false;
    }
    pbVar4 = (byte *)(this->encoding_ + (long)iVar2 + 1);
    iVar2 = iVar2 + 1;
    bVar5 = false;
    do {
      this->pos_ = iVar2;
      if (iVar3 < 0x2108421) {
        bVar1 = pbVar4[-1];
        if ((byte)(bVar1 - 0x30) < 10) {
          iVar6 = bVar1 - 0x30;
        }
        else if ((byte)(bVar1 + 0x9f) < 0x1a) {
          iVar6 = bVar1 - 0x57;
        }
        else {
          iVar6 = (char)bVar1 + -0x1d;
        }
        iVar3 = iVar3 * 0x3e + iVar6;
      }
      else {
        bVar5 = true;
      }
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      iVar2 = iVar2 + 1;
    } while (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    if (bVar1 != 0x5f) {
      return false;
    }
    this->pos_ = iVar2;
    if (bVar5) {
      return true;
    }
    iVar3 = iVar3 + 1;
  }
  *value = iVar3;
  return true;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseBase62Number(int& value) {
    value = -1;

    // base-62-number = (digit | lower | upper)* _
    //
    // An empty base-62 digit sequence means 0.
    if (Eat('_')) {
      value = 0;
      return true;
    }

    // A nonempty digit sequence denotes its base-62 value plus 1.
    int encoded_number = 0;
    bool overflowed = false;
    while (IsAlpha(Peek()) || IsDigit(Peek())) {
      const char c = Take();
      if (encoded_number >= std::numeric_limits<int>::max()/62) {
        // If we are close to overflowing an int, keep parsing but stop updating
        // encoded_number and remember to return -1 at the end.  The point is to
        // avoid undefined behavior while parsing crate-root disambiguators,
        // which are large in practice but not shown in demangling, while
        // successfully computing closure and shim disambiguators, which are
        // typically small and are printed out.
        overflowed = true;
      } else {
        int digit;
        if (IsDigit(c)) {
          digit = c - '0';
        } else if (IsLower(c)) {
          digit = c - 'a' + 10;
        } else {
          digit = c - 'A' + 36;
        }
        encoded_number = 62 * encoded_number + digit;
      }
    }

    if (!Eat('_')) return false;
    if (!overflowed) value = encoded_number + 1;
    return true;
  }